

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::CheckLinkLibraries(cmGeneratorTarget *this)

{
  cmLinkItem *pcVar1;
  bool bVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  cmLinkItem *item_1;
  cmLinkItem *pcVar7;
  string *config;
  string *config_00;
  cmLinkImplItem *item;
  undefined1 local_60 [32];
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  local_60._0_8_ = (string *)(local_60 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"LINK_LIBRARIES_ONLY_TARGETS","");
  bVar2 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_60);
  if ((string *)local_60._0_8_ != (string *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (bVar2) {
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60,this->Makefile,IncludeEmptyConfig);
    for (config_00 = (string *)local_60._0_8_; config_00 != (string *)local_60._8_8_;
        config_00 = config_00 + 1) {
      GetLinkInterfaceLibraries(this,config_00,this,Link);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  }
  for (p_Var4 = (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var6 = p_Var4[2]._M_left;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)&p_Var4[2]._M_parent;
      do {
        if (*(cmGeneratorTarget **)(p_Var6 + 1) >= this) {
          p_Var5 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(cmGeneratorTarget **)(p_Var6 + 1) < this];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((p_Var5 != (_Base_ptr)&p_Var4[2]._M_parent) &&
          (*(cmGeneratorTarget **)(p_Var5 + 1) <= this)) &&
         (*(char *)((long)&p_Var5[6]._M_parent + 1) == '\x01')) {
        pcVar1 = (cmLinkItem *)p_Var5[1]._M_left;
        for (pcVar7 = (cmLinkItem *)p_Var5[1]._M_parent; pcVar7 != pcVar1;
            pcVar7 = (cmLinkItem *)&pcVar7[1].String._M_string_length) {
          bVar3 = VerifyLinkItemColons(this,Implementation,pcVar7);
          if (!bVar3) {
            return;
          }
          if ((bVar2) && (bVar3 = VerifyLinkItemIsTarget(this,Implementation,pcVar7), !bVar3)) {
            return;
          }
        }
      }
    }
  }
  p_Var6 = (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_40) {
    do {
      p_Var5 = p_Var6[2]._M_right;
      local_38 = (_Rb_tree_node_base *)&p_Var6[2]._M_parent;
      if (p_Var5 != local_38) {
        do {
          if (*(char *)((long)&p_Var5[8]._M_right + 2) == '\x01') {
            pcVar1 = (cmLinkItem *)p_Var5[1]._M_left;
            for (pcVar7 = (cmLinkItem *)p_Var5[1]._M_parent; pcVar7 != pcVar1; pcVar7 = pcVar7 + 1)
            {
              bVar3 = VerifyLinkItemColons(this,Interface,pcVar7);
              if (!bVar3) {
                return;
              }
              if ((bVar2) && (bVar3 = VerifyLinkItemIsTarget(this,Interface,pcVar7), !bVar3)) {
                return;
              }
            }
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != local_38);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_40);
  }
  return;
}

Assistant:

void cmGeneratorTarget::CheckLinkLibraries() const
{
  bool linkLibrariesOnlyTargets =
    this->GetPropertyAsBool("LINK_LIBRARIES_ONLY_TARGETS");

  // Evaluate the link interface of this target if needed for extra checks.
  if (linkLibrariesOnlyTargets) {
    std::vector<std::string> const& configs =
      this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
    for (std::string const& config : configs) {
      this->GetLinkInterfaceLibraries(config, this, LinkInterfaceFor::Link);
    }
  }

  // Check link the implementation for each generated configuration.
  for (auto const& hmp : this->LinkImplMap) {
    HeadToLinkImplementationMap const& hm = hmp.second;
    // There could be several entries used when computing the pre-CMP0022
    // default link interface.  Check only the entry for our own link impl.
    auto const hmi = hm.find(this);
    if (hmi == hm.end() || !hmi->second.LibrariesDone) {
      continue;
    }
    for (cmLinkImplItem const& item : hmi->second.Libraries) {
      if (!this->VerifyLinkItemColons(LinkItemRole::Implementation, item)) {
        return;
      }
      if (linkLibrariesOnlyTargets &&
          !this->VerifyLinkItemIsTarget(LinkItemRole::Implementation, item)) {
        return;
      }
    }
  }

  // Check link the interface for each generated combination of
  // configuration and consuming head target.  We should not need to
  // consider LinkInterfaceUsageRequirementsOnlyMap because its entries
  // should be a subset of LinkInterfaceMap (with LINK_ONLY left out).
  for (auto const& hmp : this->LinkInterfaceMap) {
    for (auto const& hmi : hmp.second) {
      if (!hmi.second.LibrariesDone) {
        continue;
      }
      for (cmLinkItem const& item : hmi.second.Libraries) {
        if (!this->VerifyLinkItemColons(LinkItemRole::Interface, item)) {
          return;
        }
        if (linkLibrariesOnlyTargets &&
            !this->VerifyLinkItemIsTarget(LinkItemRole::Interface, item)) {
          return;
        }
      }
    }
  }
}